

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS
ref_metric_multigrad
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL *grad,REF_INT p_norm,REF_DBL gradation,
          REF_DBL target_complexity)

{
  size_t __size;
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  int iVar4;
  REF_NODE pRVar5;
  REF_GLOB *pRVar6;
  double dVar7;
  uint uVar8;
  REF_DBL *scalar;
  REF_DBL *grad_00;
  long *plVar9;
  REF_DBL *pRVar10;
  undefined8 uVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  ulong uVar15;
  REF_DBL *local_70;
  REF_DBL *local_60;
  
  pRVar5 = ref_grid->node;
  iVar4 = pRVar5->max;
  lVar12 = (long)iVar4;
  if (lVar12 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x996,
           "ref_metric_multigrad","malloc dsdx of REF_DBL negative");
    return 1;
  }
  scalar = (REF_DBL *)malloc(lVar12 * 8);
  if (scalar == (REF_DBL *)0x0) {
    pcVar13 = "malloc dsdx of REF_DBL NULL";
    uVar11 = 0x996;
    goto LAB_0018006c;
  }
  if (iVar4 != 0) {
    memset(scalar,0,lVar12 * 8);
  }
  __size = (ulong)(uint)(iVar4 * 3) * 8;
  grad_00 = (REF_DBL *)malloc(__size);
  if (grad_00 == (REF_DBL *)0x0) {
    pcVar13 = "malloc gradx of REF_DBL NULL";
    uVar11 = 0x997;
    goto LAB_0018006c;
  }
  if (iVar4 == 0) {
    local_70 = (REF_DBL *)malloc(__size);
    if (local_70 != (REF_DBL *)0x0) {
      local_60 = (REF_DBL *)malloc(__size);
      if (local_60 != (REF_DBL *)0x0) goto LAB_0017ffe2;
      goto LAB_0018004b;
    }
  }
  else {
    uVar15 = (ulong)(uint)(iVar4 * 3);
    memset(grad_00,0,uVar15 * 8);
    local_70 = (REF_DBL *)malloc(__size);
    if (local_70 != (REF_DBL *)0x0) {
      memset(local_70,0,uVar15 * 8);
      local_60 = (REF_DBL *)malloc(__size);
      if (local_60 != (REF_DBL *)0x0) {
        lVar14 = 0;
        memset(local_60,0,uVar15 << 3);
        pRVar6 = pRVar5->global;
        pRVar10 = grad;
        do {
          if (-1 < pRVar6[lVar14]) {
            scalar[lVar14] = *pRVar10;
          }
          lVar14 = lVar14 + 1;
          pRVar10 = pRVar10 + 3;
        } while (lVar12 != lVar14);
LAB_0017ffe2:
        uVar8 = ref_recon_l2_projection_grad(ref_grid,scalar,grad_00);
        if (uVar8 == 0) {
          iVar4 = pRVar5->max;
          if (0 < (long)iVar4) {
            pRVar10 = grad + 1;
            pRVar6 = pRVar5->global;
            lVar12 = 0;
            do {
              if (-1 < pRVar6[lVar12]) {
                scalar[lVar12] = *pRVar10;
              }
              lVar12 = lVar12 + 1;
              pRVar10 = pRVar10 + 3;
            } while (iVar4 != lVar12);
          }
          uVar8 = ref_recon_l2_projection_grad(ref_grid,scalar,local_70);
          if (uVar8 == 0) {
            iVar4 = pRVar5->max;
            if (0 < (long)iVar4) {
              pRVar10 = grad + 2;
              pRVar6 = pRVar5->global;
              lVar12 = 0;
              do {
                if (-1 < pRVar6[lVar12]) {
                  scalar[lVar12] = *pRVar10;
                }
                lVar12 = lVar12 + 1;
                pRVar10 = pRVar10 + 3;
              } while (iVar4 != lVar12);
            }
            uVar8 = ref_recon_l2_projection_grad(ref_grid,scalar,local_60);
            if (uVar8 == 0) {
              iVar4 = pRVar5->max;
              if (0 < (long)iVar4) {
                plVar9 = pRVar5->global;
                lVar12 = 0;
                do {
                  if (-1 < *plVar9) {
                    *(undefined8 *)((long)metric + lVar12 * 2) =
                         *(undefined8 *)((long)grad_00 + lVar12);
                    pdVar1 = (double *)((long)grad_00 + lVar12 + 8);
                    dVar7 = pdVar1[1];
                    dVar3 = *(double *)((long)local_60 + lVar12);
                    pdVar2 = (double *)((long)metric + lVar12 * 2 + 8);
                    *pdVar2 = (*(double *)((long)local_70 + lVar12) + *pdVar1) * 0.5;
                    pdVar2[1] = (dVar3 + dVar7) * 0.5;
                    *(undefined8 *)((long)metric + lVar12 * 2 + 0x18) =
                         *(undefined8 *)((long)local_70 + lVar12 + 8);
                    *(double *)((long)metric + lVar12 * 2 + 0x20) =
                         (*(double *)((long)local_70 + lVar12 + 0x10) +
                         *(double *)((long)local_60 + lVar12 + 8)) * 0.5;
                    *(undefined8 *)((long)metric + lVar12 * 2 + 0x28) =
                         *(undefined8 *)((long)local_60 + lVar12 + 0x10);
                  }
                  plVar9 = plVar9 + 1;
                  lVar12 = lVar12 + 0x18;
                } while ((long)iVar4 * 0x18 != lVar12);
              }
              free(local_60);
              free(local_70);
              free(grad_00);
              free(scalar);
              uVar8 = ref_recon_abs_value_hessian(ref_grid,metric);
              if (uVar8 == 0) {
                uVar8 = ref_recon_roundoff_limit(metric,ref_grid);
                if (uVar8 == 0) {
                  uVar8 = ref_metric_local_scale(metric,ref_grid,p_norm);
                  if (uVar8 == 0) {
                    uVar8 = ref_metric_gradation_at_complexity
                                      (metric,ref_grid,gradation,target_complexity);
                    if (uVar8 == 0) {
                      return 0;
                    }
                    pcVar13 = "gradation at complexity";
                    uVar11 = 0x9bc;
                  }
                  else {
                    pcVar13 = "local scale lp norm";
                    uVar11 = 0x9b9;
                  }
                }
                else {
                  pcVar13 = "floor metric eigenvalues based on grid size and solution jitter";
                  uVar11 = 0x9b8;
                }
              }
              else {
                pcVar13 = "abs";
                uVar11 = 0x9b5;
              }
            }
            else {
              pcVar13 = "gradz";
              uVar11 = 0x9a4;
            }
          }
          else {
            pcVar13 = "grady";
            uVar11 = 0x9a0;
          }
        }
        else {
          pcVar13 = "gradx";
          uVar11 = 0x99c;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar11,"ref_metric_multigrad",(ulong)uVar8,pcVar13);
        return uVar8;
      }
LAB_0018004b:
      pcVar13 = "malloc gradz of REF_DBL NULL";
      uVar11 = 0x999;
      goto LAB_0018006c;
    }
  }
  pcVar13 = "malloc grady of REF_DBL NULL";
  uVar11 = 0x998;
LAB_0018006c:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar11,
         "ref_metric_multigrad",pcVar13);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_metric_multigrad(REF_DBL *metric, REF_GRID ref_grid,
                                        REF_DBL *grad, REF_INT p_norm,
                                        REF_DBL gradation,
                                        REF_DBL target_complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_DBL *dsdx, *gradx, *grady, *gradz;
  ref_malloc_init(dsdx, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(gradx, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grady, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(gradz, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  i = 0;
  each_ref_node_valid_node(ref_node, node) dsdx[node] = grad[i + 3 * node];
  RSS(ref_recon_l2_projection_grad(ref_grid, dsdx, gradx), "gradx");

  i = 1;
  each_ref_node_valid_node(ref_node, node) dsdx[node] = grad[i + 3 * node];
  RSS(ref_recon_l2_projection_grad(ref_grid, dsdx, grady), "grady");

  i = 2;
  each_ref_node_valid_node(ref_node, node) dsdx[node] = grad[i + 3 * node];
  RSS(ref_recon_l2_projection_grad(ref_grid, dsdx, gradz), "gradz");

  /* average off-diagonals */
  each_ref_node_valid_node(ref_node, node) {
    metric[0 + 6 * node] = gradx[0 + 3 * node];
    metric[1 + 6 * node] = 0.5 * (gradx[1 + 3 * node] + grady[0 + 3 * node]);
    metric[2 + 6 * node] = 0.5 * (gradx[2 + 3 * node] + gradz[0 + 3 * node]);
    metric[3 + 6 * node] = grady[1 + 3 * node];
    metric[4 + 6 * node] = 0.5 * (grady[2 + 3 * node] + gradz[1 + 3 * node]);
    metric[5 + 6 * node] = gradz[2 + 3 * node];
  }

  ref_free(gradz);
  ref_free(grady);
  ref_free(gradx);
  ref_free(dsdx);

  RSS(ref_recon_abs_value_hessian(ref_grid, metric), "abs");

  RSS(ref_recon_roundoff_limit(metric, ref_grid),
      "floor metric eigenvalues based on grid size and solution jitter");
  RSS(ref_metric_local_scale(metric, ref_grid, p_norm), "local scale lp norm");
  RSS(ref_metric_gradation_at_complexity(metric, ref_grid, gradation,
                                         target_complexity),
      "gradation at complexity");

  return REF_SUCCESS;
}